

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

int __thiscall btHashString::portableStringCompare(btHashString *this,char *src,char *dst)

{
  bool bVar1;
  int ret;
  char *dst_local;
  char *src_local;
  btHashString *this_local;
  
  dst_local = dst;
  src_local = src;
  while( true ) {
    ret = (uint)(byte)*src_local - (uint)(byte)*dst_local;
    bVar1 = false;
    if (ret == 0) {
      bVar1 = *dst_local != '\0';
    }
    if (!bVar1) break;
    src_local = src_local + 1;
    dst_local = dst_local + 1;
  }
  if (ret < 0) {
    ret = -1;
  }
  else if (0 < ret) {
    ret = 1;
  }
  return ret;
}

Assistant:

int portableStringCompare(const char* src,	const char* dst) const
	{
			int ret = 0 ;

			while( ! (ret = *(unsigned char *)src - *(unsigned char *)dst) && *dst)
					++src, ++dst;

			if ( ret < 0 )
					ret = -1 ;
			else if ( ret > 0 )
					ret = 1 ;

			return( ret );
	}